

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenkoFPM.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::ComputeAverageFPM
          (ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM *this)

{
  element_type *peVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double *pdVar8;
  double *pdVar9;
  
  pdVar8 = (double *)
           (**(code **)(*(long *)(this->section_fpmA).
                                 super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 0x1b8))();
  pdVar9 = (double *)
           (**(code **)(*(long *)(this->section_fpmB).
                                 super___shared_ptr<chrono::fea::ChBeamSectionTimoshenkoAdvancedGenericFPM,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 0x1b8))();
  dVar2 = pdVar8[1];
  dVar3 = pdVar8[2];
  dVar4 = pdVar8[3];
  dVar5 = pdVar9[1];
  dVar6 = pdVar9[2];
  dVar7 = pdVar9[3];
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0] = (*pdVar8 + *pdVar9) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[1] = (dVar2 + dVar5) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[2] = (dVar3 + dVar6) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[3] = (dVar4 + dVar7) * 0.5;
  dVar2 = pdVar8[5];
  dVar3 = pdVar8[6];
  dVar4 = pdVar8[7];
  dVar5 = pdVar9[5];
  dVar6 = pdVar9[6];
  dVar7 = pdVar9[7];
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[4] = (pdVar8[4] + pdVar9[4]) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[5] = (dVar2 + dVar5) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[6] = (dVar3 + dVar6) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[7] = (dVar4 + dVar7) * 0.5;
  dVar2 = pdVar8[9];
  dVar3 = pdVar8[10];
  dVar4 = pdVar8[0xb];
  dVar5 = pdVar9[9];
  dVar6 = pdVar9[10];
  dVar7 = pdVar9[0xb];
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[8] = (pdVar8[8] + pdVar9[8]) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[9] = (dVar2 + dVar5) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[10] = (dVar3 + dVar6) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xb] = (dVar4 + dVar7) * 0.5;
  dVar2 = pdVar8[0xd];
  dVar3 = pdVar8[0xe];
  dVar4 = pdVar8[0xf];
  dVar5 = pdVar9[0xd];
  dVar6 = pdVar9[0xe];
  dVar7 = pdVar9[0xf];
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xc] = (pdVar8[0xc] + pdVar9[0xc]) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xd] = (dVar2 + dVar5) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xe] = (dVar3 + dVar6) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xf] = (dVar4 + dVar7) * 0.5;
  dVar2 = pdVar8[0x11];
  dVar3 = pdVar8[0x12];
  dVar4 = pdVar8[0x13];
  dVar5 = pdVar9[0x11];
  dVar6 = pdVar9[0x12];
  dVar7 = pdVar9[0x13];
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x10] = (pdVar8[0x10] + pdVar9[0x10]) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x11] = (dVar2 + dVar5) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x12] = (dVar3 + dVar6) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x13] = (dVar4 + dVar7) * 0.5;
  dVar2 = pdVar8[0x15];
  dVar3 = pdVar8[0x16];
  dVar4 = pdVar8[0x17];
  dVar5 = pdVar9[0x15];
  dVar6 = pdVar9[0x16];
  dVar7 = pdVar9[0x17];
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x14] = (pdVar8[0x14] + pdVar9[0x14]) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x15] = (dVar2 + dVar5) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x16] = (dVar3 + dVar6) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x17] = (dVar4 + dVar7) * 0.5;
  dVar2 = pdVar8[0x19];
  dVar3 = pdVar8[0x1a];
  dVar4 = pdVar8[0x1b];
  dVar5 = pdVar9[0x19];
  dVar6 = pdVar9[0x1a];
  dVar7 = pdVar9[0x1b];
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x18] = (pdVar8[0x18] + pdVar9[0x18]) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x19] = (dVar2 + dVar5) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1a] = (dVar3 + dVar6) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1b] = (dVar4 + dVar7) * 0.5;
  dVar2 = pdVar8[0x1d];
  dVar3 = pdVar8[0x1e];
  dVar4 = pdVar8[0x1f];
  dVar5 = pdVar9[0x1d];
  dVar6 = pdVar9[0x1e];
  dVar7 = pdVar9[0x1f];
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1c] = (pdVar8[0x1c] + pdVar9[0x1c]) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1d] = (dVar2 + dVar5) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1e] = (dVar3 + dVar6) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1f] = (dVar4 + dVar7) * 0.5;
  dVar2 = pdVar8[0x21];
  dVar3 = pdVar8[0x22];
  dVar4 = pdVar8[0x23];
  dVar5 = pdVar9[0x21];
  dVar6 = pdVar9[0x22];
  dVar7 = pdVar9[0x23];
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x20] = (pdVar8[0x20] + pdVar9[0x20]) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x21] = (dVar2 + dVar5) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x22] = (dVar3 + dVar6) * 0.5;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x23] = (dVar4 + dVar7) * 0.5;
  peVar1 = (this->super_ChBeamSectionTaperedTimoshenkoAdvancedGeneric).avg_sec_par.
           super___shared_ptr<chrono::fea::AverageSectionParameters,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0] = peVar1->EA;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[7] = peVar1->GAyy;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0xe] = peVar1->GAzz;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x15] = peVar1->GJ;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x1c] = peVar1->EIyy;
  (this->average_fpm).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
  array[0x23] = peVar1->EIzz;
  return;
}

Assistant:

void ChBeamSectionTaperedTimoshenkoAdvancedGenericFPM::ComputeAverageFPM() {
    // the elements off the diagonal are averaged by arithmetic mean
    this->average_fpm =
        0.5 * (this->section_fpmA->GetStiffnessMatrixFPM() + this->section_fpmB->GetStiffnessMatrixFPM());

    // The diagonal terms are averaged by geometrical mean, to be consistent with previous algorithm
    this->average_fpm(0, 0) = this->avg_sec_par->EA;
    this->average_fpm(1, 1) = this->avg_sec_par->GAyy;
    this->average_fpm(2, 2) = this->avg_sec_par->GAzz;
    this->average_fpm(3, 3) = this->avg_sec_par->GJ;
    this->average_fpm(4, 4) = this->avg_sec_par->EIyy;
    this->average_fpm(5, 5) = this->avg_sec_par->EIzz;
}